

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
Chainstate::ActivateBestChainStep
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexMostWork,
          shared_ptr<const_CBlock> *pblock,bool *fInvalidFound,ConnectTrace *connectTrace)

{
  pointer ppCVar1;
  CBlockIndex *pCVar2;
  Notifications *pNVar3;
  CTxMemPool *this_00;
  CBlockIndex **ppCVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CBlockIndex *pCVar8;
  CCoinsViewCache *active_coins_tip;
  int height;
  bool bVar9;
  iterator __position;
  long in_FS_OFFSET;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vpindexToConnect;
  DisconnectedBlockTransactions disconnectpool;
  CBlockIndex *local_158;
  CBlockIndex *local_120;
  CBlockIndex **local_118;
  CBlockIndex **ppCStack_110;
  CBlockIndex **local_108;
  DisconnectedBlockTransactions local_f8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  uchar local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_158 = (CBlockIndex *)0x0;
  }
  else {
    local_158 = ppCVar1[-1];
  }
  pCVar8 = CChain::FindFork(&this->m_chain,pindexMostWork);
  DisconnectedBlockTransactions::DisconnectedBlockTransactions(&local_f8,20000000);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    bVar9 = false;
  }
  else {
    pCVar2 = ppCVar1[-1];
    bVar9 = pCVar2 != pCVar8 && pCVar2 != (CBlockIndex *)0x0;
    if (pCVar2 != pCVar8 && pCVar2 != (CBlockIndex *)0x0) {
      do {
        bVar5 = DisconnectTip(this,state,&local_f8);
        if (!bVar5) {
          MaybeUpdateMempoolForReorg(this,&local_f8,false);
          pNVar3 = (this->m_chainman->m_options).notifications;
          local_88._0_8_ = (element_type *)local_78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"Failed to disconnect block.","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_68._0_8_ = &local_58;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,"Failed to disconnect block.","");
          }
          else {
            local_118 = (CBlockIndex **)0x80e27f;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_118);
          }
          (*pNVar3->_vptr_Notifications[8])(pNVar3,local_88);
          if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88)
            ;
          }
          (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._0_8_ != &local_58) {
            operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
          }
          if ((element_type *)local_88._0_8_ != (element_type *)local_78) {
            operator_delete((void *)local_88._0_8_,local_78._0_8_ + 1);
          }
          bVar9 = false;
          goto LAB_003f74be;
        }
        ppCVar1 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      } while (((ppCVar1 !=
                 (this->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start) &&
               (pCVar2 = ppCVar1[-1], pCVar2 != (CBlockIndex *)0x0)) && (pCVar2 != pCVar8));
    }
  }
  local_118 = (CBlockIndex **)0x0;
  ppCStack_110 = (CBlockIndex **)0x0;
  local_108 = (CBlockIndex **)0x0;
  if (pCVar8 == (CBlockIndex *)0x0) {
    iVar7 = -1;
  }
  else {
    iVar7 = pCVar8->nHeight;
  }
  iVar6 = pindexMostWork->nHeight;
  if (iVar7 != iVar6) {
    do {
      height = iVar7 + 0x20;
      if (iVar6 < iVar7 + 0x20) {
        height = iVar6;
      }
      if (ppCStack_110 != local_118) {
        ppCStack_110 = local_118;
      }
      std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::reserve
                ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&local_118,
                 (long)(height - iVar7));
      local_120 = CBlockIndex::GetAncestor(pindexMostWork,height);
      ppCVar4 = local_118;
      __position._M_current = ppCStack_110;
      for (; (local_118 = ppCVar4, ppCStack_110 = __position._M_current,
             local_120 != (CBlockIndex *)0x0 && (local_120->nHeight != iVar7));
          local_120 = local_120->pprev) {
        if (__position._M_current == local_108) {
          std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>::
          _M_realloc_insert<CBlockIndex*const&>
                    ((vector<CBlockIndex*,std::allocator<CBlockIndex*>> *)&local_118,__position,
                     &local_120);
        }
        else {
          *__position._M_current = local_120;
          ppCStack_110 = __position._M_current + 1;
        }
        ppCVar4 = local_118;
        __position._M_current = ppCStack_110;
      }
      while (__position._M_current != ppCVar4) {
        pCVar8 = __position._M_current[-1];
        if (pCVar8 == pindexMostWork) {
          local_88._0_8_ =
               (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_88._8_8_ =
               (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count +
                   1;
            }
          }
        }
        else {
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        bVar5 = ConnectTip(this,state,pCVar8,(shared_ptr<const_CBlock> *)local_88,connectTrace,
                           &local_f8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
        if (!bVar5) {
          if ((state->super_ValidationState<BlockValidationResult>).m_mode != M_INVALID) {
            MaybeUpdateMempoolForReorg(this,&local_f8,false);
            bVar9 = false;
            goto LAB_003f74a7;
          }
          if ((state->super_ValidationState<BlockValidationResult>).m_result != BLOCK_MUTATED) {
            InvalidChainFound(this,*local_118);
          }
          local_88._0_8_ = (element_type *)0x0;
          local_78._0_8_ = 0;
          local_68._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_58._M_allocated_capacity = 0;
          local_48[0] = '\0';
          local_48[1] = '\0';
          local_48[2] = '\0';
          local_48[3] = '\0';
          local_48[4] = '\0';
          local_48[5] = '\0';
          local_48[6] = '\0';
          local_48[7] = '\0';
          local_88._8_8_ = local_78 + 8;
          local_78._8_8_ = 0;
          local_58._8_8_ = 0;
          (state->super_ValidationState<BlockValidationResult>).m_mode = M_VALID;
          (state->super_ValidationState<BlockValidationResult>).m_result = BLOCK_RESULT_UNSET;
          local_68._8_8_ = local_58._M_local_buf + 8;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_88 + 8));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&(state->super_ValidationState<BlockValidationResult>).m_debug_message,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_68 + 8));
          if ((char *)local_68._8_8_ != local_58._M_local_buf + 8) {
            operator_delete((void *)local_68._8_8_,local_58._8_8_ + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8)) {
            operator_delete((void *)local_88._8_8_,local_78._8_8_ + 1);
          }
          *fInvalidFound = true;
          goto LAB_003f745a;
        }
        PruneBlockIndexCandidates(this);
        if (local_158 == (CBlockIndex *)0x0) goto LAB_003f745a;
        iVar7 = base_uint<256U>::CompareTo
                          (&((this->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                            super_base_uint<256U>,&(local_158->nChainWork).super_base_uint<256U>);
        __position._M_current = __position._M_current + -1;
        if (0 < iVar7) goto LAB_003f745a;
      }
      iVar6 = pindexMostWork->nHeight;
      iVar7 = height;
    } while (height != iVar6);
  }
LAB_003f745a:
  if (bVar9) {
    MaybeUpdateMempoolForReorg(this,&local_f8,true);
  }
  this_00 = this->m_mempool;
  if (this_00 != (CTxMemPool *)0x0) {
    active_coins_tip = CoinsTip(this);
    CTxMemPool::check(this_00,active_coins_tip,
                      (long)(int)((ulong)((long)(this->m_chain).vChain.
                                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_chain).vChain.
                                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  bVar9 = true;
  CheckForkWarningConditions(this);
LAB_003f74a7:
  if (local_118 != (CBlockIndex **)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
LAB_003f74be:
  DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ActivateBestChainStep(BlockValidationState& state, CBlockIndex* pindexMostWork, const std::shared_ptr<const CBlock>& pblock, bool& fInvalidFound, ConnectTrace& connectTrace)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    const CBlockIndex* pindexOldTip = m_chain.Tip();
    const CBlockIndex* pindexFork = m_chain.FindFork(pindexMostWork);

    // Disconnect active blocks which are no longer in the best chain.
    bool fBlocksDisconnected = false;
    DisconnectedBlockTransactions disconnectpool{MAX_DISCONNECTED_TX_POOL_BYTES};
    while (m_chain.Tip() && m_chain.Tip() != pindexFork) {
        if (!DisconnectTip(state, &disconnectpool)) {
            // This is likely a fatal error, but keep the mempool consistent,
            // just in case. Only remove from the mempool in this case.
            MaybeUpdateMempoolForReorg(disconnectpool, false);

            // If we're unable to disconnect a block during normal operation,
            // then that is a failure of our local system -- we should abort
            // rather than stay on a less work chain.
            FatalError(m_chainman.GetNotifications(), state, _("Failed to disconnect block."));
            return false;
        }
        fBlocksDisconnected = true;
    }

    // Build list of new blocks to connect (in descending height order).
    std::vector<CBlockIndex*> vpindexToConnect;
    bool fContinue = true;
    int nHeight = pindexFork ? pindexFork->nHeight : -1;
    while (fContinue && nHeight != pindexMostWork->nHeight) {
        // Don't iterate the entire list of potential improvements toward the best tip, as we likely only need
        // a few blocks along the way.
        int nTargetHeight = std::min(nHeight + 32, pindexMostWork->nHeight);
        vpindexToConnect.clear();
        vpindexToConnect.reserve(nTargetHeight - nHeight);
        CBlockIndex* pindexIter = pindexMostWork->GetAncestor(nTargetHeight);
        while (pindexIter && pindexIter->nHeight != nHeight) {
            vpindexToConnect.push_back(pindexIter);
            pindexIter = pindexIter->pprev;
        }
        nHeight = nTargetHeight;

        // Connect new blocks.
        for (CBlockIndex* pindexConnect : vpindexToConnect | std::views::reverse) {
            if (!ConnectTip(state, pindexConnect, pindexConnect == pindexMostWork ? pblock : std::shared_ptr<const CBlock>(), connectTrace, disconnectpool)) {
                if (state.IsInvalid()) {
                    // The block violates a consensus rule.
                    if (state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
                        InvalidChainFound(vpindexToConnect.front());
                    }
                    state = BlockValidationState();
                    fInvalidFound = true;
                    fContinue = false;
                    break;
                } else {
                    // A system error occurred (disk space, database error, ...).
                    // Make the mempool consistent with the current tip, just in case
                    // any observers try to use it before shutdown.
                    MaybeUpdateMempoolForReorg(disconnectpool, false);
                    return false;
                }
            } else {
                PruneBlockIndexCandidates();
                if (!pindexOldTip || m_chain.Tip()->nChainWork > pindexOldTip->nChainWork) {
                    // We're in a better position than we were. Return temporarily to release the lock.
                    fContinue = false;
                    break;
                }
            }
        }
    }

    if (fBlocksDisconnected) {
        // If any blocks were disconnected, disconnectpool may be non empty.  Add
        // any disconnected transactions back to the mempool.
        MaybeUpdateMempoolForReorg(disconnectpool, true);
    }
    if (m_mempool) m_mempool->check(this->CoinsTip(), this->m_chain.Height() + 1);

    CheckForkWarningConditions();

    return true;
}